

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestingUtility.cpp
# Opt level: O1

vector<pica::Vector3<double>,_std::allocator<pica::Vector3<double>_>_> * __thiscall
BaseFixture::randomVectors
          (vector<pica::Vector3<double>,_std::allocator<pica::Vector3<double>_>_>
           *__return_storage_ptr__,BaseFixture *this,int n,FP3 *minValue,FP3 *maxValue)

{
  double *pdVar1;
  pointer pVVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined1 auVar6 [16];
  allocator_type local_69;
  double local_68;
  double dStack_60;
  double local_58;
  double local_50;
  double local_48;
  double dStack_40;
  
  std::vector<pica::Vector3<double>,_std::allocator<pica::Vector3<double>_>_>::vector
            (__return_storage_ptr__,(long)n,&local_69);
  if (0 < n) {
    lVar5 = 0;
    do {
      local_50 = minValue->z;
      local_58 = maxValue->z - local_50;
      local_48 = minValue->x;
      dStack_40 = minValue->y;
      local_68 = maxValue->x;
      dStack_60 = maxValue->y;
      iVar3 = rand();
      local_68 = local_68 - local_48;
      dStack_60 = dStack_60 - dStack_40;
      iVar4 = rand();
      auVar6._0_8_ = (double)iVar3 * local_68;
      auVar6._8_8_ = (double)iVar4 * dStack_60;
      auVar6 = divpd(auVar6,_DAT_001cfb50);
      local_68 = auVar6._0_8_ + local_48;
      dStack_60 = auVar6._8_8_ + dStack_40;
      iVar3 = rand();
      pVVar2 = (__return_storage_ptr__->
               super__Vector_base<pica::Vector3<double>,_std::allocator<pica::Vector3<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pdVar1 = (double *)((long)&pVVar2->x + lVar5);
      *pdVar1 = local_68;
      pdVar1[1] = dStack_60;
      *(double *)((long)&pVVar2->z + lVar5) = ((double)iVar3 * local_58) / 2147483647.0 + local_50;
      lVar5 = lVar5 + 0x18;
    } while ((ulong)(uint)n * 0x18 != lVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<FP3> BaseFixture::randomVectors(int n, FP3 & minValue, FP3 & maxValue) {
    std::vector<FP3> result(n);
    for (int i = 0; i < n; ++i)
        result[i] = urandFP3(minValue, maxValue);
    return result;
}